

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::module_::module_(module_ *this,char *name,char *doc)

{
  char *doc_00;
  char *name_00;
  module_def *def;
  mod_gil_not_used local_35 [13];
  module_ local_28;
  char *local_20;
  char *doc_local;
  char *name_local;
  module_ *this_local;
  
  local_20 = doc;
  doc_local = name;
  name_local = (char *)this;
  object::object(&this->super_object);
  name_00 = doc_local;
  doc_00 = local_20;
  def = (module_def *)operator_new(0x68);
  def->m_traverse = (traverseproc)0x0;
  def->m_clear = (inquiry)0x0;
  def->m_methods = (PyMethodDef *)0x0;
  def->m_slots = (PyModuleDef_Slot *)0x0;
  def->m_doc = (char *)0x0;
  def->m_size = 0;
  (def->m_base).m_copy = (PyObject *)0x0;
  def->m_name = (char *)0x0;
  (def->m_base).m_init = (_func_PyObject_ptr *)0x0;
  (def->m_base).m_index = 0;
  (def->m_base).ob_base.ob_refcnt = 0;
  (def->m_base).ob_base.ob_type = (PyTypeObject *)0x0;
  def->m_free = (freefunc)0x0;
  mod_gil_not_used::mod_gil_not_used(local_35,false);
  create_extension_module(&local_28,name_00,doc_00,def,local_35[0]);
  operator=(this,&local_28);
  ~module_(&local_28);
  return;
}

Assistant:

explicit module_(const char *name, const char *doc = nullptr) {
        *this = create_extension_module(name, doc, new PyModuleDef());
    }